

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectref.hpp
# Opt level: O3

FieldRef<int> __thiscall stackjit::ClassRef::getField<int>(ClassRef *this,string *name,Type *type)

{
  bool bVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var2;
  const_iterator cVar3;
  Type *pTVar4;
  BytePtr puVar5;
  size_t sVar6;
  runtime_error *prVar7;
  string *psVar8;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  Field *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  p_Var2 = &ClassMetadata::fields_abi_cxx11_(this->mMetadata)->_M_h;
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(p_Var2,name);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_true>
      ._M_cur == (__node_type *)0x0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_68,"There exists no field called \'",name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_a8._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar10) {
      local_a8.field_2._M_allocated_capacity = *psVar10;
      local_a8.field_2._8_8_ = plVar9[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar10;
    }
    local_a8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    psVar8 = Type::name_abi_cxx11_((this->mObjRef).mType);
    std::operator+(&local_48,&local_a8,psVar8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88 = (long *)*plVar9;
    plVar11 = plVar9 + 2;
    if (local_88 == plVar11) {
      local_78 = *plVar11;
      lStack_70 = plVar9[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar11;
    }
    local_80 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(prVar7,(string *)&local_88);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var2 = &ClassMetadata::fields_abi_cxx11_(this->mMetadata)->_M_h;
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(p_Var2,name);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_00 = (Field *)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_true>
                              ._M_cur + 0x28);
    pTVar4 = Field::type(this_00);
    bVar1 = Type::operator!=(pTVar4,type);
    if (!bVar1) {
      puVar5 = ObjectRef::dataPtr(&this->mObjRef);
      sVar6 = Field::offset(this_00);
      return (FieldRef<int>)(puVar5 + sVar6);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    psVar8 = Type::name_abi_cxx11_(type);
    std::operator+(&local_68,"Expected field to be of type \'",psVar8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_a8._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar10) {
      local_a8.field_2._M_allocated_capacity = *psVar10;
      local_a8.field_2._8_8_ = plVar9[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar10;
    }
    local_a8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    pTVar4 = Field::type(this_00);
    psVar8 = Type::name_abi_cxx11_(pTVar4);
    std::operator+(&local_48,&local_a8,psVar8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88 = (long *)*plVar9;
    plVar11 = plVar9 + 2;
    if (local_88 == plVar11) {
      local_78 = *plVar11;
      lStack_70 = plVar9[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar11;
    }
    local_80 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(prVar7,(string *)&local_88);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

FieldRef<T> ClassRef::getField(std::string name, const Type* type) {
		if (mMetadata.fields().count(name) > 0) {
			auto& fieldRef = mMetadata.fields().at(name);

			if (*fieldRef.type() != *type) {
				throw std::runtime_error(
					"Expected field to be of type '" + type->name() + "' but got type '" + fieldRef.type()->name() + "'.");
			}

			return FieldRef<T>(mObjRef.dataPtr() + (std::size_t)fieldRef.offset());
		} else {
			throw std::runtime_error(
				"There exists no field called '" + name + "' in the class '" + mObjRef.type()->name() + "'.");
		}
	}